

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError *
duckdb::CSVError::SniffingError
          (CSVError *__return_storage_ptr__,CSVReaderOptions *options,string *search_space,
          idx_t max_columns_found,SetColumns *set_columns)

{
  ostream *poVar1;
  ostream *poVar2;
  ostringstream *poVar3;
  char *pcVar4;
  LinesPerBoundary local_1f8;
  string local_1e8;
  string local_1c8;
  ostringstream error;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar1 = ::std::operator<<((ostream *)&error,"Error when sniffing file \"");
  poVar1 = ::std::operator<<(poVar1,(string *)&options->file_path);
  poVar1 = ::std::operator<<(poVar1,"\".");
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&error,
                             "It was not possible to automatically detect the CSV Parsing dialect/types"
                            );
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&error,"The search space used was:");
  ::std::operator<<(poVar1,'\n');
  ::std::operator<<((ostream *)&error,(string *)search_space);
  poVar1 = ::std::operator<<((ostream *)&error,"Encoding: ");
  poVar1 = ::std::operator<<(poVar1,(string *)&options->encoding);
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&error,"Possible fixes:");
  ::std::operator<<(poVar1,'\n');
  if ((options->dialect_options).state_machine_options.strict_mode.value == true) {
    poVar1 = ::std::operator<<((ostream *)&error,
                               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
                              );
    ::std::operator<<(poVar1,'\n');
  }
  if (options->columns_set == true) {
    poVar1 = ::std::operator<<((ostream *)&error,"* Columns are set as: \"");
    SetColumns::ToString_abi_cxx11_(&local_1c8,set_columns);
    poVar1 = ::std::operator<<(poVar1,(string *)&local_1c8);
    poVar1 = ::std::operator<<(poVar1,"\", and they contain: ");
    SetColumns::Size(set_columns);
    poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = ::std::operator<<(poVar1,
                               " columns. It does not match the number of columns found by the sniffer: "
                              );
    poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = ::std::operator<<(poVar1,".");
    poVar1 = ::std::operator<<(poVar1," Verify the columns parameter is correctly set.");
    ::std::operator<<(poVar1,'\n');
    ::std::__cxx11::string::~string((string *)&local_1c8);
  }
  poVar1 = (ostream *)&error;
  poVar2 = ::std::operator<<(poVar1,
                             "* Make sure you are using the correct file encoding. If not, set it (e.g., encoding = \'utf-16\')."
                            );
  ::std::operator<<(poVar2,'\n');
  if ((options->dialect_options).state_machine_options.delimiter.set_by_user == true) {
    poVar1 = ::std::operator<<((ostream *)&error,"* Delimiter is set to \'");
    poVar1 = ::std::operator<<(poVar1,(string *)
                                      &(options->dialect_options).state_machine_options.delimiter.
                                       value);
    pcVar4 = "\'. Consider unsetting it.";
  }
  else {
    pcVar4 = "* Set delimiter (e.g., delim=\',\')";
  }
  poVar1 = ::std::operator<<(poVar1,pcVar4);
  ::std::operator<<(poVar1,'\n');
  if ((options->dialect_options).state_machine_options.quote.set_by_user == true) {
    poVar1 = ::std::operator<<((ostream *)&error,"* Quote is set to \'");
    poVar3 = (ostringstream *)
             ::std::operator<<(poVar1,(options->dialect_options).state_machine_options.quote.value);
    pcVar4 = "\'. Consider unsetting it.";
  }
  else {
    pcVar4 = "* Set quote (e.g., quote=\'\"\')";
    poVar3 = &error;
  }
  poVar1 = ::std::operator<<((ostream *)poVar3,pcVar4);
  ::std::operator<<(poVar1,'\n');
  if ((options->dialect_options).state_machine_options.escape.set_by_user == true) {
    poVar1 = ::std::operator<<((ostream *)&error,"* Escape is set to \'");
    poVar3 = (ostringstream *)
             ::std::operator<<(poVar1,(options->dialect_options).state_machine_options.escape.value)
    ;
    pcVar4 = "\'. Consider unsetting it.";
  }
  else {
    pcVar4 = "* Set escape (e.g., escape=\'\"\')";
    poVar3 = &error;
  }
  poVar1 = ::std::operator<<((ostream *)poVar3,pcVar4);
  ::std::operator<<(poVar1,'\n');
  if ((options->dialect_options).state_machine_options.comment.set_by_user == true) {
    poVar1 = ::std::operator<<((ostream *)&error,"* Comment is set to \'");
    poVar3 = (ostringstream *)
             ::std::operator<<(poVar1,(options->dialect_options).state_machine_options.comment.value
                              );
    pcVar4 = "\'. Consider unsetting it.";
  }
  else {
    pcVar4 = "* Set comment (e.g., comment=\'#\')";
    poVar3 = &error;
  }
  poVar1 = ::std::operator<<((ostream *)poVar3,pcVar4);
  ::std::operator<<(poVar1,'\n');
  if ((options->dialect_options).skip_rows.set_by_user == false) {
    poVar1 = ::std::operator<<((ostream *)&error,
                               "* Set skip (skip=${n}) to skip ${n} lines at the top of the file");
    ::std::operator<<(poVar1,'\n');
  }
  if ((options->ignore_errors).value == false) {
    poVar1 = ::std::operator<<((ostream *)&error,
                               "* Enable ignore errors (ignore_errors=true) to ignore potential errors"
                              );
    ::std::operator<<(poVar1,'\n');
  }
  if (options->null_padding == false) {
    poVar1 = ::std::operator<<((ostream *)&error,
                               "* Enable null padding (null_padding=true) to pad missing columns with NULL values"
                              );
    ::std::operator<<(poVar1,'\n');
  }
  poVar1 = ::std::operator<<((ostream *)&error,
                             "* Check you are using the correct file compression, otherwise set it (e.g., compression = \'zstd\')"
                            );
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&error,
                             "* Be sure that the maximum line size is set to an appropriate value, otherwise set it (e.g., max_line_size=10000000)"
                            );
  ::std::operator<<(poVar1,anon_var_dwarf_3b2a754 + 8);
  ::std::__cxx11::stringbuf::str();
  LinesPerBoundary::LinesPerBoundary(&local_1f8);
  CSVError(__return_storage_ptr__,&local_1e8,SNIFFING,local_1f8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::SniffingError(const CSVReaderOptions &options, const string &search_space, idx_t max_columns_found,
                                 SetColumns &set_columns) {
	std::ostringstream error;
	// 1. Which file
	error << "Error when sniffing file \"" << options.file_path << "\"." << '\n';
	// 2. What's the error
	error << "It was not possible to automatically detect the CSV Parsing dialect/types" << '\n';

	// 2. What was the search space?
	error << "The search space used was:" << '\n';
	error << search_space;
	error << "Encoding: " << options.encoding << '\n';
	// 3. Suggest how to fix it!
	error << "Possible fixes:" << '\n';
	// 3.0 Inform the user about the strict_mode
	// 3.1 Inform the reader of the dialect
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		error << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not comply with "
		         "the CSV standard."
		      << '\n';
	}
	if (options.columns_set) {
		// If columns are set, suggest to either unset it or validate that it matches the schema
		error << "* Columns are set as: \"" << set_columns.ToString() << "\", and they contain: " << set_columns.Size()
		      << " columns. It does not match the number of columns found by the sniffer: " << max_columns_found << "."
		      << " Verify the columns parameter is correctly set." << '\n';
	}
	// 3.0.1 Inform the user about encoding
	error << "* Make sure you are using the correct file encoding. If not, set it (e.g., encoding = 'utf-16')." << '\n';
	// 3.1 Inform the reader of the dialect
	// delimiter
	if (!options.dialect_options.state_machine_options.delimiter.IsSetByUser()) {
		error << "* Set delimiter (e.g., delim=\',\')" << '\n';
	} else {
		error << "* Delimiter is set to \'" << options.dialect_options.state_machine_options.delimiter.GetValue()
		      << "\'. Consider unsetting it." << '\n';
	}
	// quote
	if (!options.dialect_options.state_machine_options.quote.IsSetByUser()) {
		error << "* Set quote (e.g., quote=\'\"\')" << '\n';
	} else {
		error << "* Quote is set to \'" << options.dialect_options.state_machine_options.quote.GetValue()
		      << "\'. Consider unsetting it." << '\n';
	}
	// escape
	if (!options.dialect_options.state_machine_options.escape.IsSetByUser()) {
		error << "* Set escape (e.g., escape=\'\"\')" << '\n';
	} else {
		error << "* Escape is set to \'" << options.dialect_options.state_machine_options.escape.GetValue()
		      << "\'. Consider unsetting it." << '\n';
	}
	// comment
	if (!options.dialect_options.state_machine_options.comment.IsSetByUser()) {
		error << "* Set comment (e.g., comment=\'#\')" << '\n';
	} else {
		error << "* Comment is set to \'" << options.dialect_options.state_machine_options.comment.GetValue()
		      << "\'. Consider unsetting it." << '\n';
	}
	// 3.2 skip_rows
	if (!options.dialect_options.skip_rows.IsSetByUser()) {
		error << "* Set skip (skip=${n}) to skip ${n} lines at the top of the file" << '\n';
	}
	// 3.3 ignore_errors
	if (!options.ignore_errors.GetValue()) {
		error << "* Enable ignore errors (ignore_errors=true) to ignore potential errors" << '\n';
	}
	// 3.4 null_padding
	if (!options.null_padding) {
		error << "* Enable null padding (null_padding=true) to pad missing columns with NULL values" << '\n';
	}
	error << "* Check you are using the correct file compression, otherwise set it (e.g., compression = \'zstd\')"
	      << '\n';
	error << "* Be sure that the maximum line size is set to an appropriate value, otherwise set it (e.g., "
	         "max_line_size=10000000)"
	      << "\n";
	return CSVError(error.str(), SNIFFING, {});
}